

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRhsUnscaled(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp,
                VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *vec)

{
  int iVar1;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  DataArray<int> *rowscaleExp;
  int i;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  int iVar2;
  int in_stack_ffffffffffffff2c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff30;
  int local_4c;
  
  local_4c = 0;
  while( true ) {
    iVar2 = local_4c;
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::rhs(in_RSI);
    iVar1 = VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::dim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x74f41a);
    if (iVar1 <= iVar2) break;
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::rhs(in_RSI);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(iVar2,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffea0),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    DataArray<int>::operator[](&in_RSI->scaleExp,local_4c);
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT44(iVar2,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)CONCAT44(iVar2,in_stack_fffffffffffffea0),
               (cpp_dec_float<200U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_4c = local_4c + 1;
  }
  return;
}

Assistant:

void SPxScaler<R>::getRhsUnscaled(const SPxLPBase<R>& lp, VectorBase<R>& vec) const
{
   assert(lp.isScaled());
   assert(lp.LPRowSetBase<R>::rhs().dim() == vec.dim());

   for(int i = 0; i < lp.LPRowSetBase<R>::rhs().dim(); i++)
   {
      const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;
      vec[i] = spxLdexp(lp.LPRowSetBase<R>::rhs()[i], -rowscaleExp[i]);
   }
}